

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::gray_convert(jpeg_decoder *this)

{
  int local_2c;
  uint8 *puStack_28;
  int i;
  uint8 *s;
  uint8 *d;
  int row;
  jpeg_decoder *this_local;
  
  s = this->m_pScan_line_0;
  puStack_28 = this->m_pSample_buf + (this->m_max_mcu_y_size - this->m_mcu_lines_left) * 8;
  for (local_2c = this->m_max_mcus_per_row; 0 < local_2c; local_2c = local_2c + -1) {
    *(undefined4 *)s = *(undefined4 *)puStack_28;
    *(undefined4 *)(s + 4) = *(undefined4 *)(puStack_28 + 4);
    puStack_28 = puStack_28 + 0x40;
    s = s + 8;
  }
  return;
}

Assistant:

void jpeg_decoder::gray_convert()
{
  int row = m_max_mcu_y_size - m_mcu_lines_left;
  uint8 *d = m_pScan_line_0;
  uint8 *s = m_pSample_buf + row * 8;

  for (int i = m_max_mcus_per_row; i > 0; i--)
  {
    *(uint *)d = *(uint *)s;
    *(uint *)(&d[4]) = *(uint *)(&s[4]);

    s += 64;
    d += 8;
  }
}